

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pDVar5;
  ExprList *this_00;
  reference pvVar6;
  uint64_t uVar7;
  ulong uVar8;
  size_type sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_278;
  Enum local_270;
  Enum local_26c;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_268;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_260;
  uint local_258;
  Enum local_254;
  uint32_t num_pages;
  Location local_230;
  Const local_210;
  undefined1 local_1c0 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_1b8;
  Location local_1b0;
  Var local_190;
  DataSegment *local_148;
  DataSegment *data_segment;
  __single_object data_segment_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  iterator local_110;
  size_type local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  Enum local_e8;
  Enum local_e4;
  undefined1 local_e0 [8];
  __single_object field_1;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_b0;
  __single_object field;
  undefined1 local_98 [8];
  __single_object import;
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Memory);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)&export_fields.size_);
  ParseBindVarOpt(this,(string *)&export_fields.size_);
  intrusive_list<wabt::ModuleField>::intrusive_list
            ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
  import._M_t.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
  super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ =
       ParseInlineExports(this,(ModuleFieldList *)&stack0xffffffffffffff78,Memory);
  bVar1 = Failed(import._M_t.
                 super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                 .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    import._M_t.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
    super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_001a597d;
  }
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
             operator->((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                        local_98);
    (pMVar3->memory).page_size = 0x10000;
    pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::get
                       ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                        local_98);
    RVar2 = ParseInlineImport(this,(Import *)pMVar3);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
               operator->((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                           *)local_98);
      RVar2 = ParseLimitsIndex(this,&(pMVar3->memory).page_limits);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
                 operator->((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                             *)local_98);
        field._M_t.
        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
             ParseLimits(this,&(pMVar3->memory).page_limits);
        bVar1 = Failed(field._M_t.
                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          pMVar3 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
                   operator->((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                               *)local_98);
          field._M_t.
          super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._0_4_ =
               ParsePageSize(this,&(pMVar3->memory).page_size);
          bVar1 = Failed(field._M_t.
                         super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._0_4_
                        );
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            GetLocation((Location *)&stack0xffffffffffffff30,this);
            std::
            make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                      ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                       &local_b0,(Location *)local_98);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                          *)&field_1,&local_b0);
            Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                        *)&field_1);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           *)&field_1);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr(&local_b0);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
          }
        }
      }
    }
    std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::~unique_ptr
              ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)local_98)
    ;
  }
  else {
    std::make_unique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    pMVar4 = std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
             ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                           *)local_e0);
    (pMVar4->memory).page_size = 0x10000;
    pMVar4 = std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
             ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                           *)local_e0);
    local_e4 = (Enum)ParseLimitsIndex(this,&(pMVar4->memory).page_limits);
    bVar1 = Failed((Result)local_e4);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      bVar1 = PeekMatchLpar(this,PageSize);
      if (bVar1) {
        pMVar4 = std::
                 unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                 ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                               *)local_e0);
        local_e8 = (Enum)ParsePageSize(this,&(pMVar4->memory).page_size);
        bVar1 = Failed((Result)local_e8);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          bVar1 = PeekMatchLpar(this,Data);
          if (bVar1) goto LAB_001a54a9;
          ConsumeIfLpar(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"inline data segment",
                     (allocator<char> *)
                     ((long)&data_segment_field._M_t.
                             super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                             .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                             _M_head_impl + 7));
          local_110 = &local_130;
          local_108 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&data_segment_field._M_t.
                                 super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                 .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                                 _M_head_impl + 6));
          __l._M_len = local_108;
          __l._M_array = local_110;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_100,__l,
                   (allocator_type *)
                   ((long)&data_segment_field._M_t.
                           super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                           .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                           _M_head_impl + 6));
          this_local._4_4_ = ErrorExpected(this,&local_100,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_100);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&data_segment_field._M_t.
                                  super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                                  _M_head_impl + 6));
          local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_110;
          do {
            local_298 = local_298 + -1;
            std::__cxx11::string::~string((string *)local_298);
          } while (local_298 != &local_130);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&data_segment_field._M_t.
                             super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                             .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                             _M_head_impl + 7));
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
        }
      }
      else {
LAB_001a54a9:
        bVar1 = MatchLpar(this,Data);
        if (bVar1) {
          std::make_unique<wabt::DataSegmentModuleField,wabt::Location&>((Location *)&data_segment);
          pDVar5 = std::
                   unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                   ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                 *)&data_segment);
          local_148 = &pDVar5->data_segment;
          sVar9 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                            (&module->memories);
          GetLocation(&local_1b0,this);
          Var::Var(&local_190,(Index)sVar9,&local_1b0);
          Var::operator=(&local_148->memory_var,&local_190);
          Var::~Var(&local_190);
          this_00 = &local_148->offset;
          pMVar4 = std::
                   unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                   ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                 *)local_e0);
          if (((pMVar4->memory).page_limits.is_64 & 1U) == 0) {
            Location::Location((Location *)&num_pages);
            Const::I32(&local_210,0,(Location *)&num_pages);
          }
          else {
            Location::Location(&local_230);
            Const::I64(&local_210,0,&local_230);
          }
          std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_1c0);
          std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
          unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
                    ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_1b8,
                     (unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)local_1c0
                    );
          intrusive_list<wabt::Expr>::push_back(this_00,&local_1b8);
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_1b8);
          std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
                    ((unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)local_1c0
                    );
          pvVar6 = intrusive_list<wabt::Expr>::back(&local_148->offset);
          (pvVar6->loc).filename._M_len = (size_t)local_48;
          (pvVar6->loc).filename._M_str = (char *)loc.filename._M_len;
          (pvVar6->loc).field_1.field_1.offset = (size_t)loc.filename._M_str;
          ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
          ((long)&(pvVar6->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
          ParseTextListOpt(this,&local_148->data);
          local_254 = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_254);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&local_148->data);
            pMVar4 = std::
                     unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                   *)local_e0);
            uVar7 = WABT_BYTES_TO_MIN_PAGES(sVar9,(pMVar4->memory).page_size);
            local_258 = (uint)uVar7;
            pMVar4 = std::
                     unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                   *)local_e0);
            (pMVar4->memory).page_limits.initial = uVar7 & 0xffffffff;
            uVar8 = (ulong)local_258;
            pMVar4 = std::
                     unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                   *)local_e0);
            (pMVar4->memory).page_limits.max = uVar8;
            pMVar4 = std::
                     unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                   *)local_e0);
            (pMVar4->memory).page_limits.has_max = true;
            std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
            ::unique_ptr(&local_260,
                         (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                          *)local_e0);
            Module::AppendField(module,&local_260);
            std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
            ::~unique_ptr(&local_260);
            std::
            unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
            ::unique_ptr(&local_268,
                         (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                          *)&data_segment);
            Module::AppendField(module,&local_268);
            std::
            unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
            ::~unique_ptr(&local_268);
          }
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._1_3_ = 0;
          import._M_t.
          super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
          super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_1_ = bVar1;
          std::
          unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
          ::~unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                         *)&data_segment);
          if ((uint)import._M_t.
                    super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                    .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl == 0) {
LAB_001a58c9:
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
          }
        }
        else {
          pMVar4 = std::
                   unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                   ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                 *)local_e0);
          local_26c = (Enum)ParseLimits(this,&(pMVar4->memory).page_limits);
          bVar1 = Failed((Result)local_26c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            pMVar4 = std::
                     unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ::operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                   *)local_e0);
            local_270 = (Enum)ParsePageSize(this,&(pMVar4->memory).page_size);
            bVar1 = Failed((Result)local_270);
            if (!bVar1) {
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              unique_ptr(&local_278,
                         (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                          *)local_e0);
              Module::AppendField(module,&local_278);
              std::
              unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
              ~unique_ptr(&local_278);
              goto LAB_001a58c9;
            }
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
          }
        }
      }
    }
    std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
    ~unique_ptr((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                 *)local_e0);
  }
  if ((uint)import._M_t.
            super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t
            .super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
            super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl == 0) {
    sVar9 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size(&module->memories);
    anon_unknown_1::AppendInlineExportFields
              (module,(ModuleFieldList *)&stack0xffffffffffffff78,(int)sVar9 - 1);
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      import._M_t.
      super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
LAB_001a597d:
  intrusive_list<wabt::ModuleField>::~intrusive_list
            ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&export_fields.size_);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<MemoryImport>(name);
    import->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    CHECK_RESULT(ParsePageSize(&import->memory.page_size));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<MemoryModuleField>(loc, name);
    field->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (PeekMatchLpar(TokenType::PageSize)) {
      // this is the data abbreviation (no limits)
      CHECK_RESULT(ParsePageSize(&field->memory.page_size));
      if (!PeekMatchLpar(TokenType::Data)) {
        ConsumeIfLpar();
        return ErrorExpected({"inline data segment"});
      }
    }
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = std::make_unique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size(), GetLocation());
      data_segment.offset.push_back(std::make_unique<ConstExpr>(
          field->memory.page_limits.is_64 ? Const::I64(0) : Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t num_pages = WABT_BYTES_TO_MIN_PAGES(data_segment.data.size(),
                                                   field->memory.page_size);
      field->memory.page_limits.initial = num_pages;
      field->memory.page_limits.max = num_pages;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      CHECK_RESULT(ParsePageSize(&field->memory.page_size));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}